

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_worker-inl.h
# Opt level: O0

void __thiscall
spdlog::details::periodic_worker::periodic_worker
          (periodic_worker *this,function<void_()> *callback_fun,seconds interval)

{
  bool bVar1;
  thread *in_RDI;
  thread *__t;
  function<void_()> *__x;
  undefined7 in_stack_ffffffffffffff90;
  type *in_stack_ffffffffffffffa8;
  thread *in_stack_ffffffffffffffb0;
  
  __t = in_RDI + 1;
  std::thread::thread((thread *)0x1ad8f0);
  std::mutex::mutex((mutex *)0x1ad8fe);
  __x = (function<void_()> *)(in_RDI + 7);
  std::condition_variable::condition_variable((condition_variable *)__x);
  std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator>
                    ((duration<long,_std::ratio<1L,_1L>_> *)in_RDI,
                     (duration<long,_std::ratio<1L,_1L>_> *)__t);
  *(bool *)&(in_RDI->_M_id)._M_thread = bVar1;
  if (((in_RDI->_M_id)._M_thread & 1) != 0) {
    std::function<void_()>::function
              ((function<void_()> *)CONCAT17(bVar1,in_stack_ffffffffffffff90),__x);
    std::thread::
    thread<spdlog::details::periodic_worker::periodic_worker(std::function<void()>const&,std::chrono::duration<long,std::ratio<1l,1l>>)::__0,,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::thread::operator=(in_RDI,__t);
    std::thread::~thread((thread *)0x1ad9b1);
    periodic_worker(std::function<void()>const&,std::chrono::duration<long,std::ratio<1l,1l>>)::$_0
    ::~__0((type *)0x1ad9bb);
  }
  return;
}

Assistant:

SPDLOG_INLINE periodic_worker::periodic_worker(const std::function<void()> &callback_fun, std::chrono::seconds interval)
{
    active_ = (interval > std::chrono::seconds::zero());
    if (!active_)
    {
        return;
    }

    worker_thread_ = std::thread([this, callback_fun, interval]() {
        for (;;)
        {
            std::unique_lock<std::mutex> lock(this->mutex_);
            if (this->cv_.wait_for(lock, interval, [this] { return !this->active_; }))
            {
                return; // active_ == false, so exit this thread
            }
            callback_fun();
        }
    });
}